

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSystemTools.cxx
# Opt level: O1

bool cmSystemTools::ExtractTar(char *outFileName,bool verbose)

{
  bool bVar1;
  
  bVar1 = anon_unknown.dwarf_7587be::extract_tar(outFileName,verbose,true);
  return bVar1;
}

Assistant:

bool cmSystemTools::ExtractTar(const char* outFileName,
                               bool verbose)
{
#if defined(CMAKE_BUILD_WITH_CMAKE)
  return extract_tar(outFileName, verbose, true);
#else
  (void)outFileName;
  (void)verbose;
  return false;
#endif
}